

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Btree * sqlite3DbNameToBtree(sqlite3 *db,char *zDbName)

{
  int iVar1;
  int local_24;
  int i;
  char *zDbName_local;
  sqlite3 *db_local;
  
  local_24 = 0;
  while( true ) {
    if (db->nDb <= local_24) {
      return (Btree *)0x0;
    }
    if ((db->aDb[local_24].pBt != (Btree *)0x0) &&
       ((zDbName == (char *)0x0 ||
        (iVar1 = sqlite3_stricmp(zDbName,db->aDb[local_24].zName), iVar1 == 0)))) break;
    local_24 = local_24 + 1;
  }
  return db->aDb[local_24].pBt;
}

Assistant:

SQLITE_PRIVATE Btree *sqlite3DbNameToBtree(sqlite3 *db, const char *zDbName){
  int i;
  for(i=0; i<db->nDb; i++){
    if( db->aDb[i].pBt
     && (zDbName==0 || sqlite3StrICmp(zDbName, db->aDb[i].zName)==0)
    ){
      return db->aDb[i].pBt;
    }
  }
  return 0;
}